

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamR.cpp
# Opt level: O0

void __thiscall OpenMD::TetrahedralityParamR::writeQr(TetrahedralityParamR *this)

{
  _func_int **pp_Var1;
  double dVar2;
  byte bVar3;
  char *pcVar4;
  ostream *poVar5;
  string *psVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  undefined8 uVar11;
  StaticAnalyser *in_RDI;
  RealType Rval;
  uint i;
  ofstream qRstream;
  Revision rev;
  Revision *in_stack_fffffffffffffce8;
  Revision *in_stack_fffffffffffffd38;
  uint local_264;
  string local_260 [32];
  string local_240 [48];
  ostream local_210 [528];
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_210,pcVar4,_S_out);
  bVar3 = std::ofstream::is_open();
  if ((bVar3 & 1) == 0) {
    uVar11 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"TetrahedralityParamR: unable to open %s\n",uVar11);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar5 = std::operator<<(local_210,"# ");
    psVar6 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(local_210,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(in_stack_fffffffffffffd38);
    poVar5 = std::operator<<(poVar5,local_240);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_240);
    poVar5 = std::operator<<(local_210,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffffce8);
    poVar5 = std::operator<<(poVar5,local_260);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_260);
    poVar5 = std::operator<<(local_210,"#selection 1: (");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI[1].info_);
    std::operator<<(poVar5,")\n");
    poVar5 = std::operator<<(local_210,"#selection 2: (");
    poVar5 = std::operator<<(poVar5,(string *)(in_RDI[1].dumpFilename_.field_2._M_local_buf + 8));
    std::operator<<(poVar5,")\n");
    poVar5 = std::operator<<(local_210,"#selection 3: (");
    poVar5 = std::operator<<(poVar5,(string *)in_RDI[1].outputFilename_.field_2._M_local_buf);
    std::operator<<(poVar5,")\n");
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<(local_210,"# parameters: ");
      poVar5 = std::operator<<(poVar5,(string *)&in_RDI->paramString_);
      std::operator<<(poVar5,"\n");
    }
    poVar5 = std::operator<<(local_210,"#distance");
    std::operator<<(poVar5,"\tQk\n");
    for (local_264 = 0;
        sVar8 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)&in_RDI[0x19].dumpFilename_),
        local_264 < sVar8; local_264 = local_264 + 1) {
      pp_Var1 = in_RDI[0x19]._vptr_StaticAnalyser;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          ((long)&in_RDI[0x19].dumpFilename_.field_2 + 8),(ulong)local_264);
      if (*pvVar9 != 0) {
        poVar5 = (ostream *)
                 std::ostream::operator<<(local_210,((double)local_264 + 0.5) * (double)pp_Var1);
        poVar5 = std::operator<<(poVar5,"\t");
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&in_RDI[0x19].dumpFilename_,
                             (ulong)local_264);
        dVar2 = *pvVar10;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            ((long)&in_RDI[0x19].dumpFilename_.field_2 + 8),(ulong)local_264);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar2 / (double)*pvVar9);
        std::operator<<(poVar5,"\n");
      }
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void TetrahedralityParamR::writeQr() {
    Revision rev;
    std::ofstream qRstream(outputFilename_.c_str());
    if (qRstream.is_open()) {
      qRstream << "# " << getAnalysisType() << "\n";
      qRstream << "# OpenMD " << rev.getFullRevision() << "\n";
      qRstream << "# " << rev.getBuildDate() << "\n";
      qRstream << "#selection 1: (" << selectionScript1_ << ")\n";
      qRstream << "#selection 2: (" << selectionScript2_ << ")\n";
      qRstream << "#selection 3: (" << selectionScript3_ << ")\n";
      if (!paramString_.empty())
        qRstream << "# parameters: " << paramString_ << "\n";

      qRstream << "#distance"
               << "\tQk\n";
      for (unsigned int i = 0; i < sliceQ_.size(); ++i) {
        RealType Rval = (i + 0.5) * deltaR_;
        if (sliceCount_[i] != 0) {
          qRstream << Rval << "\t" << sliceQ_[i] / (RealType)sliceCount_[i]
                   << "\n";
        }
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "TetrahedralityParamR: unable to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    qRstream.close();
  }